

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void SetWindowSize(ImGuiWindow *window,ImVec2 *size,ImGuiCond cond)

{
  uint in_EDX;
  float *in_RSI;
  long in_RDI;
  float fVar1;
  
  if ((in_EDX == 0) || ((*(uint *)(in_RDI + 0xb4) & in_EDX) != 0)) {
    *(uint *)(in_RDI + 0xb4) = *(uint *)(in_RDI + 0xb4) & 0xfffffff1;
    if (*in_RSI <= 0.0) {
      *(undefined4 *)(in_RDI + 0x94) = 2;
      *(undefined1 *)(in_RDI + 0x9c) = 0;
    }
    else {
      *(undefined4 *)(in_RDI + 0x94) = 0;
      fVar1 = ImFloor(*in_RSI);
      *(float *)(in_RDI + 0x20) = fVar1;
    }
    if (in_RSI[1] <= 0.0) {
      *(undefined4 *)(in_RDI + 0x98) = 2;
      *(undefined1 *)(in_RDI + 0x9c) = 0;
    }
    else {
      *(undefined4 *)(in_RDI + 0x98) = 0;
      fVar1 = ImFloor(in_RSI[1]);
      *(float *)(in_RDI + 0x24) = fVar1;
    }
  }
  return;
}

Assistant:

static void SetWindowSize(ImGuiWindow* window, const ImVec2& size, ImGuiCond cond)
{
    // Test condition (NB: bit 0 is always true) and clear flags for next time
    if (cond && (window->SetWindowSizeAllowFlags & cond) == 0)
        return;

    IM_ASSERT(cond == 0 || ImIsPowerOfTwo(cond)); // Make sure the user doesn't attempt to combine multiple condition flags.
    window->SetWindowSizeAllowFlags &= ~(ImGuiCond_Once | ImGuiCond_FirstUseEver | ImGuiCond_Appearing);

    // Set
    if (size.x > 0.0f)
    {
        window->AutoFitFramesX = 0;
        window->SizeFull.x = ImFloor(size.x);
    }
    else
    {
        window->AutoFitFramesX = 2;
        window->AutoFitOnlyGrows = false;
    }
    if (size.y > 0.0f)
    {
        window->AutoFitFramesY = 0;
        window->SizeFull.y = ImFloor(size.y);
    }
    else
    {
        window->AutoFitFramesY = 2;
        window->AutoFitOnlyGrows = false;
    }
}